

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNBu31.h
# Opt level: O2

void __thiscall NaPNBus3i1o::~NaPNBus3i1o(NaPNBus3i1o *this)

{
  *(undefined **)this = &NaPNDelay::vtable;
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(this + 0x120));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0xd8));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x48));
  NaPetriNode::~NaPetriNode((NaPetriNode *)this);
  return;
}

Assistant:

class PNNA_API NaPNBus3i1o : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNBus3i1o (const char* szNodeName = "bus3i1o");


    ////////////////
    // Connectors //
    ////////////////

    // Input #1 (mainstream)
    NaPetriCnInput      in1;

    // Input #2
    NaPetriCnInput      in2;

    // Input #3
    NaPetriCnInput      in3;

    // Output (mainstream)
    NaPetriCnOutput     out;


    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();

    
    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

}